

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

void __thiscall
protozero::Message::AppendVarInt<perfetto::protos::gen::ChromeFrameReporter_FrameType>
          (Message *this,uint32_t field_id,ChromeFrameReporter_FrameType value)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint8_t buffer [15];
  byte local_27 [15];
  
  if (this->nested_message_ != (Message *)0x0) {
    uVar2 = Finalize(this->nested_message_);
    this->size_ = this->size_ + uVar2;
    MessageArena::DeleteLastMessageInternal(this->arena_);
    this->nested_message_ = (Message *)0x0;
  }
  uVar6 = field_id << 3;
  pbVar5 = local_27;
  uVar7 = uVar6;
  if (0x7f < uVar6) {
    do {
      *pbVar5 = (byte)uVar7 | 0x80;
      pbVar5 = pbVar5 + 1;
      uVar6 = uVar7 >> 7;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  *pbVar5 = (byte)uVar6;
  pbVar5 = pbVar5 + 1;
  uVar3 = (ulong)(int)value;
  uVar4 = uVar3;
  if (0x7f < value) {
    do {
      *pbVar5 = (byte)uVar3 | 0x80;
      pbVar5 = pbVar5 + 1;
      uVar4 = uVar3 >> 7;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar4;
    } while (bVar1);
  }
  *pbVar5 = (byte)uVar4;
  WriteToStream(this,local_27,pbVar5 + 1);
  return;
}

Assistant:

void AppendVarInt(uint32_t field_id, T value) {
    if (nested_message_)
      EndNestedMessage();

    uint8_t buffer[proto_utils::kMaxSimpleFieldEncodedSize];
    uint8_t* pos = buffer;

    pos = proto_utils::WriteVarInt(proto_utils::MakeTagVarInt(field_id), pos);
    // WriteVarInt encodes signed values in two's complement form.
    pos = proto_utils::WriteVarInt(value, pos);
    WriteToStream(buffer, pos);
  }